

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O0

string * char2hex_abi_cxx11_(string *__return_storage_ptr__,char dec)

{
  byte local_14;
  byte local_13 [3];
  char dig2;
  char dig1;
  string *psStack_10;
  char dec_local;
  string *r;
  
  local_13[1] = 0;
  local_13[2] = dec;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_13[0] = (byte)((int)((int)(char)local_13[2] & 0xf0U) >> 4);
  local_14 = local_13[2] & 0xf;
  if (local_13[0] < 10) {
    local_13[0] = local_13[0] + 0x30;
  }
  if ((9 < local_13[0]) && (local_13[0] < 0x10)) {
    local_13[0] = local_13[0] + 0x37;
  }
  if (local_14 < 10) {
    local_14 = local_14 + 0x30;
  }
  if ((9 < local_14) && (local_14 < 0x10)) {
    local_14 = local_14 + 0x37;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_13);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_14);
  return __return_storage_ptr__;
}

Assistant:

std::string char2hex(char dec)
{
	std::string r;
	char dig1 = (dec&0xF0)>>4;
	char dig2 = (dec&0x0F);
	if ( 0<= dig1 && dig1<= 9) dig1+=48;    //0,48 in ascii
	if (10<= dig1 && dig1<=15) dig1+=65-10; //A,65 in ascii
	if ( 0<= dig2 && dig2<= 9) dig2+=48;
	if (10<= dig2 && dig2<=15) dig2+=65-10;

	r.append( &dig1, 1);
	r.append( &dig2, 1);
	return r;
}